

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  long in_FS_OFFSET;
  bool bVar4;
  int gtest_retval;
  int bytes_read;
  DeathTestImpl *this_local;
  allocator<char> local_13d;
  GTestLog local_13c;
  GTestLog local_138;
  char local_131;
  undefined1 local_130 [7];
  char flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    iVar1 = read_fd(this);
    iVar1 = posix::Read(iVar1,&local_131,1);
    bVar4 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (iVar1 == 0) {
    set_outcome(this,DIED);
  }
  else if (iVar1 == 1) {
    switch(local_131) {
    case 'I':
      iVar1 = read_fd(this);
      FailFromInternalError(iVar1);
      break;
    default:
      GTestLog::GTestLog(&local_138,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                         ,0x1e1);
      poVar3 = GTestLog::GetStream(&local_138);
      poVar3 = std::operator<<(poVar3,"Death test child process reported ");
      poVar3 = std::operator<<(poVar3,"unexpected status byte (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)local_131);
      std::operator<<(poVar3,")");
      GTestLog::~GTestLog(&local_138);
      break;
    case 'L':
      set_outcome(this,LIVED);
      break;
    case 'R':
      set_outcome(this,RETURNED);
      break;
    case 'T':
      set_outcome(this,THREW);
    }
  }
  else {
    GTestLog::GTestLog(&local_13c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                       ,0x1e6);
    poVar3 = GTestLog::GetStream(&local_13c);
    poVar3 = std::operator<<(poVar3,"Read from death test child process failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator<<(poVar3,local_30);
    std::__cxx11::string::~string(local_30);
    GTestLog::~GTestLog(&local_13c);
  }
  do {
    do {
      iVar1 = read_fd(this);
      iVar1 = posix::Close(iVar1);
      bVar4 = false;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    if (iVar1 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"CHECK failed: File ",&local_13d);
      std::operator+(&local_f0,&local_110,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_d0,&local_f0,", line ");
      this_local._4_4_ = 0x1e9;
      StreamableToString<int>((string *)local_130,(int *)((long)&this_local + 4));
      std::operator+(&local_b0,&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130)
      ;
      std::operator+(&local_90,&local_b0,": ");
      std::operator+(&local_70,&local_90,"posix::Close(read_fd())");
      std::operator+(&local_50,&local_70," != -1");
      DeathTestAbort(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_13d);
    }
    bVar4 = AlwaysFalse();
  } while (bVar4);
  set_read_fd(this,-1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}